

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O2

bool __thiscall
uWS::HttpResponse<true>::internalEnd
          (HttpResponse<true> *this,string_view data,int totalSize,bool optional,
          bool allowContentLength)

{
  bool bVar1;
  bool bVar2;
  HttpResponseData<true> *httpResponseData;
  ulong uVar3;
  uint uVar4;
  int __fd;
  ulong uVar5;
  bool bVar6;
  string_view status;
  void *pvStack_40;
  
  uVar5 = data._M_len;
  status._M_str = "200 OK";
  status._M_len = 6;
  writeStatus(this,status);
  if (totalSize == 0) {
    totalSize = (uint)data._M_len;
  }
  httpResponseData =
       (HttpResponseData<true> *)AsyncSocket<true>::getAsyncSocketData((AsyncSocket<true> *)this);
  if ((httpResponseData->state & 2U) == 0) {
    if ((httpResponseData->state & 4U) == 0) {
      writeMark(this);
      if (allowContentLength) {
        AsyncSocket<true>::write((AsyncSocket<true> *)this,0x17b0e8,(void *)0x10,0);
        writeUnsigned(this,totalSize);
        __fd = 0x17b0e3;
        pvStack_40 = (void *)0x4;
      }
      else {
        __fd = 0x17b0e5;
        pvStack_40 = (void *)0x2;
      }
      AsyncSocket<true>::write((AsyncSocket<true> *)this,__fd,pvStack_40,0);
      *(byte *)&httpResponseData->state = (byte)httpResponseData->state | 4;
    }
    uVar3 = AsyncSocket<true>::write
                      ((AsyncSocket<true> *)this,(int)data._M_str,(void *)(uVar5 & 0xffffffff),
                       (ulong)optional);
    uVar4 = httpResponseData->offset + (int)uVar3;
    httpResponseData->offset = uVar4;
    bVar1 = (uVar3 & 0x100000000) == 0;
    bVar2 = (uVar3 & 0xffffffff) == uVar5;
    bVar6 = bVar1 && bVar2;
    if ((!bVar1 || !bVar2) || uVar4 == totalSize) {
      AsyncSocket<true>::timeout((AsyncSocket<true> *)this,10);
      uVar4 = httpResponseData->offset;
    }
    if (uVar4 == totalSize) {
      markDone(this,httpResponseData);
    }
  }
  else {
    if (uVar5 != 0) {
      AsyncSocket<true>::write((AsyncSocket<true> *)this,0x17b0e5,(void *)0x2,0);
      writeUnsignedHex(this,(uint)data._M_len);
      AsyncSocket<true>::write((AsyncSocket<true> *)this,0x17b0e5,(void *)0x2,0);
      AsyncSocket<true>::write
                ((AsyncSocket<true> *)this,(int)data._M_str,(void *)(uVar5 & 0xffffffff),0);
    }
    AsyncSocket<true>::write((AsyncSocket<true> *)this,0x17b0e0,(void *)0x7,0);
    markDone(this,httpResponseData);
    AsyncSocket<true>::timeout((AsyncSocket<true> *)this,10);
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool internalEnd(std::string_view data, int totalSize, bool optional, bool allowContentLength = true) {
        /* Write status if not already done */
        writeStatus(HTTP_200_OK);

        /* If no total size given then assume this chunk is everything */
        if (!totalSize) {
            totalSize = (int) data.length();
        }

        HttpResponseData<SSL> *httpResponseData = getHttpResponseData();
        if (httpResponseData->state & HttpResponseData<SSL>::HTTP_WRITE_CALLED) {

            /* We do not have tryWrite-like functionalities, so ignore optional in this path */

            /* Do not allow sending 0 chunk here */
            if (data.length()) {
                Super::write("\r\n", 2);
                writeUnsignedHex((unsigned int) data.length());
                Super::write("\r\n", 2);

                /* Ignoring optional for now */
                Super::write(data.data(), (int) data.length());
            }

            /* Terminating 0 chunk */
            Super::write("\r\n0\r\n\r\n", 7);

            markDone(httpResponseData);

            /* tryEnd can never fail when in chunked mode, since we do not have tryWrite (yet), only write */
            Super::timeout(HTTP_TIMEOUT_S);
            return true;
        } else {
            /* Write content-length on first call */
            if (!(httpResponseData->state & HttpResponseData<SSL>::HTTP_END_CALLED)) {
                /* Write mark, this propagates to WebSockets too */
                writeMark();

                /* WebSocket upgrades does not allow content-length */
                if (allowContentLength) {
                    /* Even zero is a valid content-length */
                    Super::write("Content-Length: ", 16);
                    writeUnsigned(totalSize);
                    Super::write("\r\n\r\n", 4);
                } else {
                    Super::write("\r\n", 2);
                }

                /* Mark end called */
                httpResponseData->state |= HttpResponseData<SSL>::HTTP_END_CALLED;
            }

            /* Even if we supply no new data to write, its failed boolean is useful to know
             * if it failed to drain any prior failed header writes */

            /* Write as much as possible without causing backpressure */
            auto [written, failed] = Super::write(data.data(), (int) data.length(), optional);
            httpResponseData->offset += written;

            /* Success is when we wrote the entire thing without any failures */
            bool success = (unsigned int) written == data.length() && !failed;

            /* If we are now at the end, start a timeout. Also start a timeout if we failed. */
            if (!success || httpResponseData->offset == totalSize) {
                Super::timeout(HTTP_TIMEOUT_S);
            }

            /* Remove onAborted function if we reach the end */
            if (httpResponseData->offset == totalSize) {
                markDone(httpResponseData);
            }

            return success;
        }
    }